

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O2

void __thiscall
(anonymous_namespace)::IntrusiveListIteratorTest::
TestForward<std::reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>>
          (IntrusiveListIteratorTest *this,
          reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
          *first,reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
                 *last,vector<int,_std::allocator<int>_> *expected)

{
  intrusive_list<(anonymous_namespace)::TestObject> *piVar1;
  bool bVar2;
  pointer pTVar3;
  long lVar4;
  int line;
  unsigned_long uVar5;
  long lVar6;
  char *message;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  AssertionResult gtest_ar;
  AssertHelper local_40;
  unsigned_long local_38;
  
  lVar6 = 0;
  uVar5 = 0;
  do {
    local_38 = uVar5;
    bVar2 = std::operator!=((reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
                             *)this,first);
    if (!bVar2) {
      local_58.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)(last->current).node_ - (long)(last->current).list_ >> 2);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&gtest_ar,"count","expected.size()",&local_38,
                 (unsigned_long *)&local_58);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_58);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        line = 0xa6;
LAB_001f9ce1:
        testing::internal::AssertHelper::AssertHelper
                  (&local_40,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-intrusive-list.cc"
                   ,line,message);
        testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_58);
        testing::internal::AssertHelper::~AssertHelper(&local_40);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_58);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      return;
    }
    piVar1 = (last->current).list_;
    pTVar3 = std::
             reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
             ::operator->((reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
                           *)this);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"expected[count]","first->data",
               (int *)((long)&piVar1->first_ + lVar6),&pTVar3->data);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_58);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      line = 0xa2;
      goto LAB_001f9ce1;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    lVar4 = *(long *)(this + 8);
    if (lVar4 == 0) {
      lVar4 = *(long *)this;
    }
    *(undefined8 *)(this + 8) = *(undefined8 *)(lVar4 + 8);
    uVar5 = uVar5 + 1;
    lVar6 = lVar6 + 4;
  } while( true );
}

Assistant:

void TestForward(Iter first, Iter last, const std::vector<int>& expected) {
    size_t count = 0;
    while (first != last) {
      ASSERT_EQ(expected[count], first->data);
      ++first;
      ++count;
    }
    ASSERT_EQ(count, expected.size());
  }